

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  FileDescriptor *file_00;
  int i;
  int index;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar1;
  FileDescriptor *local_18;
  
  if (file != (FileDescriptor *)0x0) {
    local_18 = file;
    pVar1 = std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)&this->dependencies_,&local_18);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      for (index = 0; (local_18 != (FileDescriptor *)0x0 && (index < *(int *)(local_18 + 0x24)));
          index = index + 1) {
        file_00 = FileDescriptor::public_dependency(local_18,index);
        RecordPublicDependencies(this,file_00);
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == nullptr || !dependencies_.insert(file).second) return;
  for (int i = 0; file != nullptr && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}